

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase257::run(TestCase257 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  Builder value;
  Builder value_00;
  Builder value_01;
  Builder value_02;
  bool bVar1;
  undefined8 in_stack_fffffffffffffc78;
  Builder local_370;
  StringTree local_340;
  String local_308;
  bool local_2e9;
  undefined1 auStack_2e8 [7];
  bool _kj_shouldLog_1;
  SegmentBuilder *pSStack_2e0;
  CapTableBuilder *local_2d8;
  void *pvStack_2d0;
  WirePointer *local_2c8;
  undefined8 uStack_2c0;
  StringTree local_2b8;
  String local_280;
  SegmentBuilder *local_268;
  SegmentBuilder *pSStack_260;
  CapTableBuilder *local_258;
  void *pvStack_250;
  WirePointer *local_248;
  Builder local_240;
  StringTree local_210;
  String local_1d8;
  bool local_1b9;
  undefined1 auStack_1b8 [7];
  bool _kj_shouldLog;
  SegmentBuilder *pSStack_1b0;
  CapTableBuilder *local_1a8;
  void *pvStack_1a0;
  WirePointer *local_198;
  undefined8 uStack_190;
  StringTree local_188;
  String local_150;
  undefined1 auStack_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase257 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)auStack_128,(MessageBuilder *)this_00);
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestAllTypes::Builder&,void>
            ((Builder *)auStack_1b8,(Builder *)auStack_128);
  value.builder.segment = (SegmentBuilder *)local_1a8;
  value.schema.super_Schema.raw = (Schema)(Schema)pSStack_1b0;
  value.builder.capTable = (CapTableBuilder *)pvStack_1a0;
  value.builder.data = local_198;
  value.builder.pointers = (WirePointer *)uStack_190;
  value.builder.dataSize = (int)in_stack_fffffffffffffc78;
  value.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  value.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffc78 >> 0x30);
  prettyPrint(value);
  kj::StringTree::flatten(&local_150,&local_188);
  bVar1 = kj::operator==("( voidField = void,\n  boolField = false,\n  int8Field = 0,\n  int16Field = 0,\n  int32Field = 0,\n  int64Field = 0,\n  uInt8Field = 0,\n  uInt16Field = 0,\n  uInt32Field = 0,\n  uInt64Field = 0,\n  float32Field = 0,\n  float64Field = 0,\n  enumField = foo,\n  interfaceField = void )"
                         ,&local_150);
  kj::String::~String(&local_150);
  kj::StringTree::~StringTree(&local_188);
  if (!bVar1) {
    local_1b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b9 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestAllTypes::Builder&,void>
                (&local_240,(Builder *)auStack_128);
      value_00.builder.segment = (SegmentBuilder *)local_240.builder.capTable;
      value_00.schema.super_Schema.raw = (Schema)(Schema)local_240.builder.segment;
      value_00.builder.capTable = (CapTableBuilder *)local_240.builder.data;
      value_00.builder.data = local_240.builder.pointers;
      value_00.builder.pointers = (WirePointer *)local_240.builder._32_8_;
      value_00.builder.dataSize = (int)in_stack_fffffffffffffc78;
      value_00.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffc78 >> 0x20);
      value_00.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffc78 >> 0x30);
      uStack_190 = local_240.builder._32_8_;
      prettyPrint(value_00);
      kj::StringTree::flatten(&local_1d8,&local_210);
      kj::_::Debug::log<char_const(&)[378],char_const(&)[272],kj::String>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x113,ERROR,
                 "\"failed: expected \" \"(\\\"( voidField = void,\\\\n\\\" \\\"  boolField = false,\\\\n\\\" \\\"  int8Field = 0,\\\\n\\\" \\\"  int16Field = 0,\\\\n\\\" \\\"  int32Field = 0,\\\\n\\\" \\\"  int64Field = 0,\\\\n\\\" \\\"  uInt8Field = 0,\\\\n\\\" \\\"  uInt16Field = 0,\\\\n\\\" \\\"  uInt32Field = 0,\\\\n\\\" \\\"  uInt64Field = 0,\\\\n\\\" \\\"  float32Field = 0,\\\\n\\\" \\\"  float64Field = 0,\\\\n\\\" \\\"  enumField = foo,\\\\n\\\" \\\"  interfaceField = void )\\\") == (prettyPrint(root).flatten())\", \"( voidField = void,\\n\" \"  boolField = false,\\n\" \"  int8Field = 0,\\n\" \"  int16Field = 0,\\n\" \"  int32Field = 0,\\n\" \"  int64Field = 0,\\n\" \"  uInt8Field = 0,\\n\" \"  uInt16Field = 0,\\n\" \"  uInt32Field = 0,\\n\" \"  uInt64Field = 0,\\n\" \"  float32Field = 0,\\n\" \"  float64Field = 0,\\n\" \"  enumField = foo,\\n\" \"  interfaceField = void )\", prettyPrint(root).flatten()"
                 ,(char (*) [378])
                  "failed: expected (\"( voidField = void,\\n\" \"  boolField = false,\\n\" \"  int8Field = 0,\\n\" \"  int16Field = 0,\\n\" \"  int32Field = 0,\\n\" \"  int64Field = 0,\\n\" \"  uInt8Field = 0,\\n\" \"  uInt16Field = 0,\\n\" \"  uInt32Field = 0,\\n\" \"  uInt64Field = 0,\\n\" \"  float32Field = 0,\\n\" \"  float64Field = 0,\\n\" \"  enumField = foo,\\n\" \"  interfaceField = void )\") == (prettyPrint(root).flatten())"
                 ,(char (*) [272])
                  "( voidField = void,\n  boolField = false,\n  int8Field = 0,\n  int16Field = 0,\n  int32Field = 0,\n  int64Field = 0,\n  uInt8Field = 0,\n  uInt16Field = 0,\n  uInt32Field = 0,\n  uInt64Field = 0,\n  float32Field = 0,\n  float64Field = 0,\n  enumField = foo,\n  interfaceField = void )"
                 ,&local_1d8);
      kj::String::~String(&local_1d8);
      kj::StringTree::~StringTree(&local_210);
      local_1b9 = false;
    }
  }
  local_248 = root._builder.pointers;
  local_258 = root._builder.capTable;
  pvStack_250 = root._builder.data;
  local_268 = (SegmentBuilder *)auStack_128;
  pSStack_260 = root._builder.segment;
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = (StructDataBitCount)uStack_190;
  builder_00._builder.pointerCount = SUB82(uStack_190,4);
  builder_00._builder._38_2_ = SUB82(uStack_190,6);
  initTestMessage(builder_00);
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestAllTypes::Builder&,void>
            ((Builder *)auStack_2e8,(Builder *)auStack_128);
  value_01.builder.segment = (SegmentBuilder *)local_2d8;
  value_01.schema.super_Schema.raw = (Schema)(Schema)pSStack_2e0;
  value_01.builder.capTable = (CapTableBuilder *)pvStack_2d0;
  value_01.builder.data = local_2c8;
  value_01.builder.pointers = (WirePointer *)uStack_2c0;
  value_01.builder.dataSize = (int)in_stack_fffffffffffffc78;
  value_01.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  value_01.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffc78 >> 0x30);
  prettyPrint(value_01);
  kj::StringTree::flatten(&local_280,&local_2b8);
  bVar1 = kj::operator==("( voidField = void,\n  boolField = true,\n  int8Field = -123,\n  int16Field = -12345,\n  int32Field = -12345678,\n  int64Field = -123456789012345,\n  uInt8Field = 234,\n  uInt16Field = 45678,\n  uInt32Field = 3456789012,\n  uInt64Field = 12345678901234567890,\n  float32Field = 1234.5,\n  float64Field = -1.23e47,\n  textField = \"foo\",\n  dataField = \"bar\",\n  structField = (\n    voidField = void,\n    boolField = true,\n    int8Field = -12,\n    int16Field = 3456,\n    int32Field = -78901234,\n    int64Field = 56789012345678,\n    uInt8Field = 90,\n    uInt16Field = 1234,\n    uInt32Field = 56789012,\n    uInt64Field = 345678901234567890,\n    float32Field = -1.25e-10,\n    float64Field = 345,\n    textField = \"baz\",\n    dataField = \"qux\",\n    structField = (\n      voidField = void,\n      boolField = false,\n      int8Field = 0,\n      int16Field = 0,\n      int32Field = 0,\n      int64Field = 0,\n      uInt8Field = 0,\n      uInt16Field = 0,\n      uInt32Field = 0,\n      uInt64Field = 0,\n      float32Field = 0,\n      float64Field = 0,\n      textField = \"nested\",\n      structField = (\n        voidField = void,\n        boolField = false,\n        int8Field = 0,\n        int16Field = 0,\n        int32Field = 0,\n        int64Field = 0,\n        uInt8Field = 0,\n        uInt16Field = 0,\n        uInt32Field = 0,\n        uInt64Field = 0,\n        float32Field = 0,\n        float64Field = 0,\n        textField = \"really nested\",\n        enumField = foo,\n        interfaceField = void ),\n      enumField = foo,\n      interfaceField = void ),\n    enumField = baz,\n    interfaceField = void,\n    voidList = [void, void, void],\n    boolList = [false, true, false, true, true],\n    int8List = [12, -34, -128, 127],\n    int16List = [1234, -5678, -32768, 32767],\n    int32List = [12345678, -90123456, -2147483648, 2147483647],\n    int64List = [123456789012345, -678901234567890, -9223372036854775808, 9223372036854775807],\n    uInt8List = [12, 34, 0, 255],\n    uInt16List = [1234, 5678, 0, 65535],\n    uInt32List = [12345678, 90123456, 0, 4294967295],\n    uInt64List = [1234567890..." /* TRUNCATED STRING LITERAL */
                         ,&local_280);
  kj::String::~String(&local_280);
  kj::StringTree::~StringTree(&local_2b8);
  if (!bVar1) {
    local_2e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e9 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestAllTypes::Builder&,void>
                (&local_370,(Builder *)auStack_128);
      value_02.builder.segment = (SegmentBuilder *)local_370.builder.capTable;
      value_02.schema.super_Schema.raw = (Schema)(Schema)local_370.builder.segment;
      value_02.builder.capTable = (CapTableBuilder *)local_370.builder.data;
      value_02.builder.data = local_370.builder.pointers;
      value_02.builder.pointers = (WirePointer *)local_370.builder._32_8_;
      value_02.builder.dataSize = (int)in_stack_fffffffffffffc78;
      value_02.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffc78 >> 0x20);
      value_02.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffc78 >> 0x30);
      prettyPrint(value_02);
      kj::StringTree::flatten(&local_308,&local_340);
      kj::_::Debug::log<char_const(&)[6138],char_const(&)[5289],kj::String>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x1d4,ERROR,
                 "\"failed: expected \" \"(\\\"( voidField = void,\\\\n\\\" \\\"  boolField = true,\\\\n\\\" \\\"  int8Field = -123,\\\\n\\\" \\\"  int16Field = -12345,\\\\n\\\" \\\"  int32Field = -12345678,\\\\n\\\" \\\"  int64Field = -123456789012345,\\\\n\\\" \\\"  uInt8Field = 234,\\\\n\\\" \\\"  uInt16Field = 45678,\\\\n\\\" \\\"  uInt32Field = 3456789012,\\\\n\\\" \\\"  uInt64Field = 12345678901234567890,\\\\n\\\" \\\"  float32Field = 1234.5,\\\\n\\\" \\\"  float64Field = -1.23e47,\\\\n\\\" \\\"  textField = \\\\\\\"foo\\\\\\\",\\\\n\\\" \\\"  dataField = \\\\\\\"bar\\\\\\\",\\\\n\\\" \\\"  structField = (\\\\n\\\" \\\"    voidField = void,\\\\n\\\" \\\"    boolField = true,\\\\n\\\" \\\"    int8Field = -12,\\\\n\\\" \\\"    int16Field = 3456,\\\\n\\\" \\\"    int32Field = -78901234,\\\\n\\\" \\\"    int64Field = 56789012345678,\\\\n\\\" \\\"    uInt8Field = 90,\\\\n\\\" \\\"    uInt16Field = 1234,\\\\n\\\" \\\"    uInt32Field = 56789012,\\\\n\\\" \\\"    uInt64Field = 345678901234567890,\\\\n\\\" \\\"    float32Field = -1.25e-10,\\\\n\\\" \\\"    float64Field = 345,\\\\n\\\" \\\"    textField = \\\\\\\"baz\\\\\\\",\\\\n\\\" \\\"    dataField = \\\\\\\"qux\\\\\\\",\\\\n\\\" \\\"    structField = (\\\\n\\\" \\\"      voidField = void,\\\\n\\\" \\\"      boolField = false,\\\\n\\\" \\\"      int8Field = 0,\\\\n\\\" \\\"      int16Field = 0,\\\\n\\\" \\\"      int32Field = 0,\\\\n\\\" \\\"      int64Field = 0,\\\\n\\\" \\\"      uInt8Field = 0,\\\\n\\\" \\\"      uInt16Field = 0,\\\\n\\\" \\\"      uInt32Field = 0,\\\\n\\\" \\\"      uInt64Field = 0,\\\\n\\\" \\\"      float32Field = 0,\\\\n\\\" \\\"      float64Field = 0,\\\\n\\\" \\\"      textField = \\\\\\\"nested\\\\\\\",\\\\n\\\" \\\"      structField = (\\\\n\\\" \\\"        voidField = void,\\\\n\\\" \\\"        boolField = false,\\\\n\\\" \\\"        int8Field = 0,\\\\n\\\" \\\"        int16Field = 0,\\\\n\\\" \\\"        int32Field = 0,\\\\n\\\" \\\"        int64Field = 0,\\\\n\\\" \\\"        uInt8Field = 0,\\\\n\\\" \\\"        uInt16Field = 0,\\\\n\\\" \\\"        uInt32Field = 0,\\\\n\\\" \\\"        uInt64Field = 0,\\\\n\\\" \\\"        float32Field = 0,\\\\n\\\" \\\"        float64Field = 0,\\\\n\\\" \\\"        textField = \\\\\\\"really nested\\\\\\\",\\\\n\\\" \\\"        enumField = foo,\\\\n\\\" \\\"        interfaceField = void ),\\\\n\\\" \\\"      enumField = foo,\\\\n\\\" \\\"      interfaceField = void ),\\\\n\\\" \\\"    enumField = baz,\\\\n\\\" \\\"    interfaceFiel..." /* TRUNCATED STRING LITERAL */
                 ,(char (*) [6138])
                  "failed: expected (\"( voidField = void,\\n\" \"  boolField = true,\\n\" \"  int8Field = -123,\\n\" \"  int16Field = -12345,\\n\" \"  int32Field = -12345678,\\n\" \"  int64Field = -123456789012345,\\n\" \"  uInt8Field = 234,\\n\" \"  uInt16Field = 45678,\\n\" \"  uInt32Field = 3456789012,\\n\" \"  uInt64Field = 12345678901234567890,\\n\" \"  float32Field = 1234.5,\\n\" \"  float64Field = -1.23e47,\\n\" \"  textField = \\\"foo\\\",\\n\" \"  dataField = \\\"bar\\\",\\n\" \"  structField = (\\n\" \"    voidField = void,\\n\" \"    boolField = true,\\n\" \"    int8Field = -12,\\n\" \"    int16Field = 3456,\\n\" \"    int32Field = -78901234,\\n\" \"    int64Field = 56789012345678,\\n\" \"    uInt8Field = 90,\\n\" \"    uInt16Field = 1234,\\n\" \"    uInt32Field = 56789012,\\n\" \"    uInt64Field = 345678901234567890,\\n\" \"    float32Field = -1.25e-10,\\n\" \"    float64Field = 345,\\n\" \"    textField = \\\"baz\\\",\\n\" \"    dataField = \\\"qux\\\",\\n\" \"    structField = (\\n\" \"      voidField = void,\\n\" \"      boolField = false,\\n\" \"      int8Field = 0,\\n\" \"      int16Field = 0,\\n\" \"      int32Field = 0,\\n\" \"      int64Field = 0,\\n\" \"      uInt8Field = 0,\\n\" \"      uInt16Field = 0,\\n\" \"      uInt32Field = 0,\\n\" \"      uInt64Field = 0,\\n\" \"      float32Field = 0,\\n\" \"      float64Field = 0,\\n\" \"      textField = \\\"nested\\\",\\n\" \"      structField = (\\n\" \"        voidField = void,\\n\" \"        boolField = false,\\n\" \"        int8Field = 0,\\n\" \"        int16Field = 0,\\n\" \"        int32Field = 0,\\n\" \"        int64Field = 0,\\n\" \"        uInt8Field = 0,\\n\" \"        uInt16Field = 0,\\n\" \"        uInt32Field = 0,\\n\" \"        uInt64Field = 0,\\n\" \"        float32Field = 0,\\n\" \"        float64Field = 0,\\n\" \"        textField = \\\"really nested\\\",\\n\" \"        enumField = foo,\\n\" \"        interfaceField = void ),\\n\" \"      enumField = foo,\\n\" \"      interfaceField = void ),\\n\" \"    enumField = baz,\\n\" \"    interfaceField = void,\\n\" \"    voidList = [void, void, void],\\n\" \"    boolList = [false, true, false, true, true],\\n\" \"    int8List = [12, -34, -128, 127],\\n\" \"    int16List = [1234, -5678, -32768, 32767],\\n\" \"    int32List = [1..." /* TRUNCATED STRING LITERAL */
                 ,(char (*) [5289])
                  "( voidField = void,\n  boolField = true,\n  int8Field = -123,\n  int16Field = -12345,\n  int32Field = -12345678,\n  int64Field = -123456789012345,\n  uInt8Field = 234,\n  uInt16Field = 45678,\n  uInt32Field = 3456789012,\n  uInt64Field = 12345678901234567890,\n  float32Field = 1234.5,\n  float64Field = -1.23e47,\n  textField = \"foo\",\n  dataField = \"bar\",\n  structField = (\n    voidField = void,\n    boolField = true,\n    int8Field = -12,\n    int16Field = 3456,\n    int32Field = -78901234,\n    int64Field = 56789012345678,\n    uInt8Field = 90,\n    uInt16Field = 1234,\n    uInt32Field = 56789012,\n    uInt64Field = 345678901234567890,\n    float32Field = -1.25e-10,\n    float64Field = 345,\n    textField = \"baz\",\n    dataField = \"qux\",\n    structField = (\n      voidField = void,\n      boolField = false,\n      int8Field = 0,\n      int16Field = 0,\n      int32Field = 0,\n      int64Field = 0,\n      uInt8Field = 0,\n      uInt16Field = 0,\n      uInt32Field = 0,\n      uInt64Field = 0,\n      float32Field = 0,\n      float64Field = 0,\n      textField = \"nested\",\n      structField = (\n        voidField = void,\n        boolField = false,\n        int8Field = 0,\n        int16Field = 0,\n        int32Field = 0,\n        int64Field = 0,\n        uInt8Field = 0,\n        uInt16Field = 0,\n        uInt32Field = 0,\n        uInt64Field = 0,\n        float32Field = 0,\n        float64Field = 0,\n        textField = \"really nested\",\n        enumField = foo,\n        interfaceField = void ),\n      enumField = foo,\n      interfaceField = void ),\n    enumField = baz,\n    interfaceField = void,\n    voidList = [void, void, void],\n    boolList = [false, true, false, true, true],\n    int8List = [12, -34, -128, 127],\n    int16List = [1234, -5678, -32768, 32767],\n    int32List = [12345678, -90123456, -2147483648, 2147483647],\n    int64List = [123456789012345, -678901234567890, -9223372036854775808, 9223372036854775807],\n    uInt8List = [12, 34, 0, 255],\n    uInt16List = [1234, 5678, 0, 65535],\n    uInt32List = [12345678, 90123456, 0, 4294967295],\n    uInt64List = [1234567890..." /* TRUNCATED STRING LITERAL */
                 ,&local_308);
      kj::String::~String(&local_308);
      kj::StringTree::~StringTree(&local_340);
      local_2e9 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Stringify, PrettyPrint) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  EXPECT_EQ(
      "( voidField = void,\n"
      "  boolField = false,\n"
      "  int8Field = 0,\n"
      "  int16Field = 0,\n"
      "  int32Field = 0,\n"
      "  int64Field = 0,\n"
      "  uInt8Field = 0,\n"
      "  uInt16Field = 0,\n"
      "  uInt32Field = 0,\n"
      "  uInt64Field = 0,\n"
      "  float32Field = 0,\n"
      "  float64Field = 0,\n"
      "  enumField = foo,\n"
      "  interfaceField = void )", prettyPrint(root).flatten());

  initTestMessage(root);

  EXPECT_EQ(
      "( voidField = void,\n"
      "  boolField = true,\n"
      "  int8Field = -123,\n"
      "  int16Field = -12345,\n"
      "  int32Field = -12345678,\n"
      "  int64Field = -123456789012345,\n"
      "  uInt8Field = 234,\n"
      "  uInt16Field = 45678,\n"
      "  uInt32Field = 3456789012,\n"
      "  uInt64Field = 12345678901234567890,\n"
      "  float32Field = 1234.5,\n"
      "  float64Field = -1.23e47,\n"
      "  textField = \"foo\",\n"
      "  dataField = \"bar\",\n"
      "  structField = (\n"
      "    voidField = void,\n"
      "    boolField = true,\n"
      "    int8Field = -12,\n"
      "    int16Field = 3456,\n"
      "    int32Field = -78901234,\n"
      "    int64Field = 56789012345678,\n"
      "    uInt8Field = 90,\n"
      "    uInt16Field = 1234,\n"
      "    uInt32Field = 56789012,\n"
      "    uInt64Field = 345678901234567890,\n"
      "    float32Field = -1.25e-10,\n"
      "    float64Field = 345,\n"
      "    textField = \"baz\",\n"
      "    dataField = \"qux\",\n"
      "    structField = (\n"
      "      voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"nested\",\n"
      "      structField = (\n"
      "        voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"really nested\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ),\n"
      "      enumField = foo,\n"
      "      interfaceField = void ),\n"
      "    enumField = baz,\n"
      "    interfaceField = void,\n"
      "    voidList = [void, void, void],\n"
      "    boolList = [false, true, false, true, true],\n"
      "    int8List = [12, -34, -128, 127],\n"
      "    int16List = [1234, -5678, -32768, 32767],\n"
      "    int32List = [12345678, -90123456, -2147483648, 2147483647],\n"
      "    int64List = [123456789012345, -678901234567890, "
                       "-9223372036854775808, 9223372036854775807],\n"
      "    uInt8List = [12, 34, 0, 255],\n"
      "    uInt16List = [1234, 5678, 0, 65535],\n"
      "    uInt32List = [12345678, 90123456, 0, 4294967295],\n"
      "    uInt64List = [123456789012345, 678901234567890, 0, 18446744073709551615],\n"
      "    float32List = [0, 1234567, 1e37, -1e37, 1e-37, -1e-37],\n"
      "    float64List = [0, 123456789012345, 1e306, -1e306, 1e-306, -1e-306],\n"
      "    textList = [\"quux\", \"corge\", \"grault\"],\n"
      "    dataList = [\"garply\", \"waldo\", \"fred\"],\n"
      "    structList = [\n"
      "      ( voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"x structlist 1\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ),\n"
      "      ( voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"x structlist 2\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ),\n"
      "      ( voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"x structlist 3\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ) ],\n"
      "    enumList = [qux, bar, grault] ),\n"
      "  enumField = corge,\n"
      "  interfaceField = void,\n"
      "  voidList = [void, void, void, void, void, void],\n"
      "  boolList = [true, false, false, true],\n"
      "  int8List = [111, -111],\n"
      "  int16List = [11111, -11111],\n"
      "  int32List = [111111111, -111111111],\n"
      "  int64List = [1111111111111111111, -1111111111111111111],\n"
      "  uInt8List = [111, 222],\n"
      "  uInt16List = [33333, 44444],\n"
      "  uInt32List = [3333333333],\n"
      "  uInt64List = [11111111111111111111],\n"
      "  float32List = [5555.5, inf, -inf, nan],\n"
      "  float64List = [7777.75, inf, -inf, nan],\n"
      "  textList = [\"plugh\", \"xyzzy\", \"thud\"],\n"
      "  dataList = [\"oops\", \"exhausted\", \"rfc3092\"],\n"
      "  structList = [\n"
      "    ( voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"structlist 1\",\n"
      "      enumField = foo,\n"
      "      interfaceField = void ),\n"
      "    ( voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"structlist 2\",\n"
      "      enumField = foo,\n"
      "      interfaceField = void ),\n"
      "    ( voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"structlist 3\",\n"
      "      enumField = foo,\n"
      "      interfaceField = void ) ],\n"
      "  enumList = [foo, garply] )",
      prettyPrint(root).flatten());
}